

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O0

void mov_DdRd(PDISASM pMyDisasm)

{
  int iVar1;
  Int32 IVar2;
  PDISASM pMyDisasm_local;
  
  if ((pMyDisasm->Reserved_).VEX.state == '\x01') {
    failDecode(pMyDisasm);
  }
  else {
    (pMyDisasm->Instruction).Category = 0xa0000;
    strcpy((pMyDisasm->Instruction).Mnemonic,"mov");
    IVar2 = 0x20;
    if ((pMyDisasm->Reserved_).Architecture == 0x40) {
      IVar2 = 0x40;
    }
    (pMyDisasm->Reserved_).OperandSize = IVar2;
    iVar1 = Security(2,pMyDisasm);
    if (iVar1 != 0) {
      (pMyDisasm->Reserved_).RM_ = *(byte *)((pMyDisasm->Reserved_).EIP_ + 1) & 7;
      (*ModRM_3[(pMyDisasm->Reserved_).RM_])(&pMyDisasm->Operand2,pMyDisasm);
      (pMyDisasm->Reserved_).Register_ = 0x80;
      decodeRegOpcode(&pMyDisasm->Operand1,pMyDisasm);
      FillFlags(pMyDisasm,0x43);
      (pMyDisasm->Reserved_).EIP_ = (pMyDisasm->Reserved_).EIP_ + 2;
    }
  }
  return;
}

Assistant:

void __bea_callspec__ mov_DdRd(PDISASM pMyDisasm)
{
  if (GV.VEX.state == InUsePrefix) {
    failDecode(pMyDisasm);
    return;
  }
  pMyDisasm->Instruction.Category = SYSTEM_INSTRUCTION;
  #ifndef BEA_LIGHT_DISASSEMBLY
     (void) strcpy (pMyDisasm->Instruction.Mnemonic, "mov");
  #endif
  GV.OperandSize = (GV.Architecture == 64) ? 64 : 32;
  if (!Security(2, pMyDisasm)) return;
  GV.RM_  = (*((UInt8*) (GV.EIP_+1))) & 0x7;
  ModRM_3[GV.RM_](&pMyDisasm->Operand2, pMyDisasm);
  GV.Register_ = DR_REG;
  decodeRegOpcode(&pMyDisasm->Operand1, pMyDisasm);

  FillFlags(pMyDisasm,67);
  GV.EIP_ += 2;
}